

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::AtomEscapePass1
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,Node **node,
          MatchCharNode *deferredCharNode,bool *previousSurrogatePart)

{
  EncodedChar **p;
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  undefined4 *puVar8;
  Node *pNVar9;
  byte *pbVar10;
  Char CVar11;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPVar12;
  int iVar13;
  EncodedChar cc;
  CharCount n;
  CharCount i;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  byte *pbVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  Char local_3a;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPStack_38;
  Char c;
  
  pbVar10 = this->inputLim;
  pbVar18 = this->next;
  pPStack_38 = this;
  if (pbVar10 <= pbVar18) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x643,"(!IsEOF())","!IsEOF()");
    if (!bVar3) goto LAB_00ec9856;
    *puVar8 = 0;
    pbVar10 = pPStack_38->inputLim;
    pbVar18 = pPStack_38->next;
  }
  p = &pPStack_38->next;
  if (pbVar10 < pbVar18) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ec9856;
    *puVar8 = 0;
    pbVar18 = *p;
  }
  bVar4 = *pbVar18;
  uVar21 = (ulong)bVar4;
  if ((ASCIIChars::classes[uVar21] & 0x10) != 0) {
    if (pPStack_38->inputLim < pbVar18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ec9856;
      *puVar8 = 0;
      pbVar18 = *p;
      uVar21 = (ulong)*pbVar18;
    }
    if ((char)uVar21 == '0') {
      pbVar10 = pPStack_38->inputLim;
      uVar21 = 0x30;
    }
    else {
      iVar13 = 0;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      pPVar12 = pPStack_38;
      lVar17 = 2;
      do {
        lVar20 = lVar17;
        pbVar10 = pPVar12->inputLim;
        if (pbVar10 < pbVar18 + lVar20 + -2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ec9856;
          *puVar8 = 0;
          pbVar10 = pPStack_38->inputLim;
          pbVar18 = pPStack_38->next;
          uVar21 = (ulong)pbVar18[lVar20 + -2];
          pPVar12 = pPStack_38;
        }
        iVar13 = (uint)(byte)ASCIIChars::values[uVar21] + iVar13 * 10;
        if (lVar20 == 6) {
          uVar21 = 5;
          goto LAB_00ec8d50;
        }
        if (pbVar10 < pbVar18 + lVar20) {
          uVar21 = lVar20 - 1;
          goto LAB_00ec8d50;
        }
        if (pbVar10 < pbVar18 + lVar20 + -1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ec9856;
          *puVar8 = 0;
          pbVar18 = *p;
          pPVar12 = pPStack_38;
        }
        uVar21 = (ulong)pbVar18[lVar20 + -1];
        lVar17 = lVar20 + 1;
      } while ((ASCIIChars::classes[uVar21] & 0x10) != 0);
      pbVar10 = pPVar12->inputLim;
      uVar21 = lVar20 - 1;
LAB_00ec8d50:
      if (iVar13 < (int)(uint)pPVar12->numGroups) {
        uVar15 = uVar21 & 0xffffffff;
        if (pbVar18 + lVar20 <= pbVar10) {
          if (pbVar10 < pbVar18 + uVar15) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar3) goto LAB_00ec9856;
            *puVar8 = 0;
            pbVar10 = pPStack_38->inputLim;
            pbVar18 = pPStack_38->next;
            pPVar12 = pPStack_38;
          }
          if ((ASCIIChars::classes[pbVar18[uVar15]] & 0x10) != 0) goto LAB_00ec8f06;
        }
        if (pbVar10 < pbVar18 + uVar15) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ec9856;
          *puVar8 = 0;
          pPVar12 = pPStack_38;
        }
        uVar16 = 0;
        do {
          if ((char)(*p)[uVar16] < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                               "!this->IsMultiUnitChar(next[i])");
            if (!bVar3) goto LAB_00ec9856;
            *puVar8 = 0;
            pPVar12 = pPStack_38;
          }
          uVar16 = uVar16 + 1;
          if (uVar21 == uVar16) {
            pPVar12->next = pPVar12->next + uVar15;
            pNVar9 = (Node *)new<Memory::ArenaAllocator>(0x40,pPVar12->ctAllocator,0x364470);
            pNVar9->tag = MatchGroup;
            pNVar9->features = 0;
            *(uint *)&pNVar9->field_0xc = *(uint *)&pNVar9->field_0xc & 0xffff8000;
            pNVar9->firstSet = (CharSet<char16_t> *)0x0;
            pNVar9->followSet = (CharSet<char16_t> *)0x0;
            (pNVar9->prevConsumes).lower = 0;
            *(undefined8 *)&(pNVar9->prevConsumes).upper = 0xffffffff;
            *(undefined8 *)&(pNVar9->thisConsumes).upper = 0xffffffff;
            (pNVar9->followConsumes).upper = 0xffffffff;
            pNVar9->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542e70;
            *(int *)&pNVar9[1]._vptr_Node = iVar13;
            *node = pNVar9;
            return false;
          }
        } while( true );
      }
LAB_00ec8f06:
      if (pbVar10 < pbVar18) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9856;
        *puVar8 = 0;
        pbVar10 = pPStack_38->inputLim;
        pbVar18 = pPStack_38->next;
      }
      uVar21 = (ulong)*pbVar18;
      if ((ASCIIChars::classes[uVar21] & 0x20) == 0) {
        if (pbVar10 < pbVar18) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ec9856;
          *puVar8 = 0;
          pbVar10 = pPStack_38->inputLim;
          pbVar18 = pPStack_38->next;
          uVar21 = (ulong)*pbVar18;
        }
        deferredCharNode->cs[0] = (Char)uVar21;
        if (pbVar10 < pbVar18 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ec9856;
          *puVar8 = 0;
          pbVar18 = *p;
        }
        if (-1 < (char)*pbVar18) {
LAB_00ec9080:
          *p = pbVar18 + 1;
          *node = &deferredCharNode->super_Node;
          return false;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (bVar3) {
          *puVar8 = 0;
          pbVar18 = *p;
          goto LAB_00ec9080;
        }
        goto LAB_00ec9856;
      }
    }
    if (pbVar10 < pbVar18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ec9856;
      *puVar8 = 0;
      pbVar18 = *p;
      uVar21 = (ulong)*pbVar18;
    }
    if ((ASCIIChars::classes[uVar21] & 0x20) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x670,"(standardEncodedChars->IsOctal(ECLookahead()))",
                         "standardEncodedChars->IsOctal(ECLookahead())");
      if (!bVar3) {
LAB_00ec9856:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
      pbVar18 = *p;
    }
    else {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    iVar13 = 3;
    pPVar12 = pPStack_38;
    uVar14 = 0;
    do {
      if (pPVar12->inputLim < pbVar18) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9856;
        *puVar8 = 0;
        pbVar18 = *p;
        pPVar12 = pPStack_38;
      }
      bVar4 = *pbVar18;
      uVar19 = (uint)(byte)ASCIIChars::values[bVar4] + uVar14 * 8;
      if (0xff < uVar19) break;
      if (pPVar12->inputLim < pbVar18 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9856;
        *puVar8 = 0;
        pbVar18 = *p;
        bVar4 = *pbVar18;
        pPVar12 = pPStack_38;
      }
      if ((char)bVar4 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar3) goto LAB_00ec9856;
        *puVar8 = 0;
        pbVar18 = *p;
        pPVar12 = pPStack_38;
      }
      pbVar18 = pbVar18 + 1;
      *p = pbVar18;
      iVar13 = iVar13 + -1;
      uVar14 = uVar19;
      if (iVar13 == 0) break;
      if (pPVar12->inputLim < pbVar18) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9856;
        *puVar8 = 0;
        pbVar18 = *p;
        pPVar12 = pPStack_38;
      }
    } while ((ASCIIChars::classes[*pbVar18] & 0x20) != 0);
    deferredCharNode->cs[0] = (Char)uVar14;
LAB_00ec93da:
    *node = &deferredCharNode->super_Node;
    return false;
  }
  if (pPStack_38->inputLim < pbVar18) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ec9856;
    *puVar8 = 0;
    pbVar18 = *p;
    bVar4 = *pbVar18;
  }
  if (bVar4 == 99) {
    if (pPStack_38->inputLim < pbVar18 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ec9856;
      *puVar8 = 0;
      pbVar18 = *p;
    }
    bVar4 = pbVar18[1];
    CVar11 = L'\\';
    if ((ASCIIChars::classes[bVar4] & 8) != 0) {
      pbVar10 = pPStack_38->inputLim;
      if (pbVar10 < pbVar18 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9856;
        *puVar8 = 0;
        pbVar10 = pPStack_38->inputLim;
        pbVar18 = pPStack_38->next;
        bVar4 = pbVar18[1];
      }
      if (pbVar10 < pbVar18 + 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9856;
        *puVar8 = 0;
      }
      else {
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      }
      pPStack_38 = (Parser<UTF8EncodingPolicyBase<false>,_false> *)
                   CONCAT44(pPStack_38._4_4_,(uint)(bVar4 & 0x1f));
      lVar17 = 0;
      do {
        if ((char)(*p)[lVar17] < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar3) goto LAB_00ec9856;
          *puVar8 = 0;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 2);
      *p = *p + 2;
      CVar11 = (Char)pPStack_38;
    }
    deferredCharNode->cs[0] = CVar11;
    goto LAB_00ec93da;
  }
  pbVar10 = pPStack_38->inputLim;
  if (pbVar10 <= pbVar18) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x25d,"(!IsEOF())","!IsEOF()");
    if (!bVar3) goto LAB_00ec9856;
    *puVar8 = 0;
    pbVar10 = pPStack_38->inputLim;
  }
  local_3a = UTF8EncodingPolicyBase<false>::ReadFull<true>
                       (&pPStack_38->super_UTF8EncodingPolicyBase<false>,p,pbVar10);
  pPVar12 = pPStack_38;
  switch(local_3a) {
  case L'S':
    cc = 'S';
    goto LAB_00ec97a3;
  case L'T':
  case L'U':
  case L'V':
  case L'X':
  case L'Y':
  case L'Z':
  case L'_':
  case L'`':
  case L'a':
  case L'c':
  case L'e':
  case L'g':
  case L'h':
  case L'i':
  case L'j':
  case L'k':
  case L'l':
  case L'm':
  case L'o':
  case L'p':
  case L'q':
  case L'y':
  case L'z':
    goto switchD_00ec8bc5_caseD_54;
  case L'W':
    cc = 'W';
LAB_00ec97a3:
    deferredCharNode = (MatchCharNode *)GetNodeWithValidCharacterSet(pPStack_38,cc);
    goto LAB_00ec8d41;
  case L'[':
  case L'\\':
  case L']':
  case L'^':
  case L'{':
  case L'|':
  case L'}':
    break;
  case L'b':
    deferredCharNode =
         (MatchCharNode *)new<Memory::ArenaAllocator>(0x40,pPStack_38->ctAllocator,0x364470);
    (((MatchSetNode *)deferredCharNode)->super_Node).tag = WordBoundary;
    (((MatchSetNode *)deferredCharNode)->super_Node).features = 0;
    puVar1 = &(((MatchSetNode *)deferredCharNode)->super_Node).field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
    (((MatchSetNode *)deferredCharNode)->super_Node).firstSet = (CharSet<char16_t> *)0x0;
    (((MatchSetNode *)deferredCharNode)->super_Node).followSet = (CharSet<char16_t> *)0x0;
    (((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.lower = 0;
    *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.upper = 0xffffffff
    ;
    *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).thisConsumes.upper = 0xffffffff
    ;
    (((MatchSetNode *)deferredCharNode)->super_Node).followConsumes.upper = 0xffffffff;
    (((MatchSetNode *)deferredCharNode)->super_Node)._vptr_Node =
         (_func_int **)&PTR_LiteralLength_01542850;
    ((MatchSetNode *)deferredCharNode)->isNegation = false;
    ((MatchSetNode *)deferredCharNode)->needsEquivClass = false;
LAB_00ec9831:
    ((MatchSetNode *)deferredCharNode)->field_0x3a = 0;
    bVar3 = true;
    goto LAB_00ec8d44;
  case L'd':
    bVar3 = false;
    deferredCharNode =
         (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,pPStack_38->ctAllocator,0x364470);
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    StandardChars<char16_t>::SetDigits
              (pPVar12->standardChars,pPVar12->ctAllocator,&((MatchSetNode *)deferredCharNode)->set)
    ;
    goto LAB_00ec8d44;
  case L'f':
    local_3a = L'\f';
    break;
  case L'n':
    local_3a = L'\n';
    break;
  case L'r':
    local_3a = L'\r';
    break;
  case L's':
    bVar3 = false;
    deferredCharNode =
         (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,pPStack_38->ctAllocator,0x364470);
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    StandardChars<char16_t>::SetWhitespace
              (pPVar12->standardChars,pPVar12->ctAllocator,&((MatchSetNode *)deferredCharNode)->set)
    ;
    goto LAB_00ec8d44;
  case L't':
    local_3a = L'\t';
    break;
  case L'u':
    if ((((pPStack_38->unicodeFlagPresent != true) ||
         (iVar13 = TryParseExtendedUnicodeEscape(pPStack_38,&local_3a,previousSurrogatePart,false),
         iVar13 < 1)) &&
        ((pPStack_38->next + 4 <= pPStack_38->inputLim &&
         (((bVar4 = ECLookahead(pPStack_38,0), (ASCIIChars::classes[bVar4] & 0x40) != 0 &&
           (bVar4 = ECLookahead(pPStack_38,1), (ASCIIChars::classes[bVar4] & 0x40) != 0)) &&
          (bVar4 = ECLookahead(pPStack_38,2), (ASCIIChars::classes[bVar4] & 0x40) != 0)))))) &&
       (bVar4 = ECLookahead(pPStack_38,3), pPVar12 = pPStack_38,
       (ASCIIChars::classes[bVar4] & 0x40) != 0)) {
      bVar4 = ECLookahead(pPStack_38,0);
      bVar4 = ASCIIChars::values[bVar4];
      bVar5 = ECLookahead(pPVar12,1);
      bVar5 = ASCIIChars::values[bVar5];
      bVar6 = ECLookahead(pPVar12,2);
      bVar6 = ASCIIChars::values[bVar6];
      bVar7 = ECLookahead(pPVar12,3);
      local_3a = Chars<char16_t>::UTC
                           ((uint)(byte)ASCIIChars::values[bVar7] | (uint)bVar6 << 4 |
                            (uint)bVar5 << 8 | (uint)bVar4 << 0xc);
      n = 4;
LAB_00ec952d:
      ECConsume(pPVar12,n);
    }
    break;
  case L'v':
    local_3a = L'\v';
    break;
  case L'w':
    deferredCharNode =
         (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,pPStack_38->ctAllocator,0x364470);
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    if ((pPVar12->unicodeFlagPresent == true) && (pPVar12->caseInsensitiveFlagPresent == true)) {
      StandardChars<char16_t>::SetWordIUChars
                (pPVar12->standardChars,pPVar12->ctAllocator,
                 &((MatchSetNode *)deferredCharNode)->set);
    }
    else {
      StandardChars<char16_t>::SetWordChars
                (pPVar12->standardChars,pPVar12->ctAllocator,
                 &((MatchSetNode *)deferredCharNode)->set);
    }
    goto LAB_00ec8d41;
  case L'x':
    if (((pPStack_38->next + 2 <= pPStack_38->inputLim) &&
        (bVar4 = ECLookahead(pPStack_38,0), (ASCIIChars::classes[bVar4] & 0x40) != 0)) &&
       (bVar4 = ECLookahead(pPStack_38,1), pPVar12 = pPStack_38,
       (ASCIIChars::classes[bVar4] & 0x40) != 0)) {
      bVar4 = ECLookahead(pPStack_38,0);
      bVar4 = ASCIIChars::values[bVar4];
      bVar5 = ECLookahead(pPVar12,1);
      local_3a = Chars<char16_t>::UTC((uint)(byte)ASCIIChars::values[bVar5] | (uint)bVar4 << 4);
      n = 2;
      goto LAB_00ec952d;
    }
    break;
  default:
    uVar21 = (ulong)((ushort)local_3a - 0x24);
    if ((ushort)local_3a - 0x24 < 0x21) {
      if ((0x8000cf1UL >> (uVar21 & 0x3f) & 1) != 0) break;
      if (uVar21 == 0x1e) {
        deferredCharNode =
             (MatchCharNode *)new<Memory::ArenaAllocator>(0x40,pPStack_38->ctAllocator,0x364470);
        (((MatchSetNode *)deferredCharNode)->super_Node).tag = WordBoundary;
        (((MatchSetNode *)deferredCharNode)->super_Node).features = 0;
        puVar1 = &(((MatchSetNode *)deferredCharNode)->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (((MatchSetNode *)deferredCharNode)->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (((MatchSetNode *)deferredCharNode)->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.upper =
             0xffffffff;
        *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).thisConsumes.upper =
             0xffffffff;
        (((MatchSetNode *)deferredCharNode)->super_Node).followConsumes.upper = 0xffffffff;
        (((MatchSetNode *)deferredCharNode)->super_Node)._vptr_Node =
             (_func_int **)&PTR_LiteralLength_01542850;
        ((MatchSetNode *)deferredCharNode)->isNegation = true;
        ((MatchSetNode *)deferredCharNode)->needsEquivClass = false;
        goto LAB_00ec9831;
      }
      if (uVar21 == 0x20) {
        cc = 'D';
        goto LAB_00ec97a3;
      }
    }
    goto switchD_00ec8bc5_caseD_54;
  }
switchD_00ec8bc5_caseD_5b:
  deferredCharNode->cs[0] = local_3a;
LAB_00ec8d41:
  bVar3 = false;
LAB_00ec8d44:
  *node = &deferredCharNode->super_Node;
  return bVar3;
switchD_00ec8bc5_caseD_54:
  if (pPStack_38->unicodeFlagPresent == true) {
    Fail(pPStack_38,-0x7ff5e9d6);
  }
  goto switchD_00ec8bc5_caseD_5b;
}

Assistant:

bool Parser<P, IsLiteral>::AtomEscapePass1(Node*& node, MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        Assert(!IsEOF()); // checked for terminating 0 in pass 0
        if (standardEncodedChars->IsDigit(ECLookahead()))
        {
            // As per Annex B, allow octal escapes as well as group references, disambiguate based on known
            // number of groups.
            if (ECLookahead() == '0')
            {
                // fall through for octal
            }
            else
            {
                // Could be a group reference, but only if between 1 and 5 digits which resolve to a valid group number
                int n = 0;
                CharCount digits = 0;
                do
                {
                    n = n * 10 + (int)standardEncodedChars->DigitValue(ECLookahead(digits));
                    digits++;
                }
                while (digits < 5 && ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits)));
                if (n >= numGroups ||
                    (ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits))))
                {
                    if (standardEncodedChars->IsOctal(ECLookahead()))
                    {
                        // fall through for octal
                    }
                    else
                    {
                        // \8 and \9 are identity escapes
                        deferredCharNode->cs[0] = Chars<EncodedChar>::CTW(ECLookahead());
                        ECConsume();
                        node = deferredCharNode;
                        return false; // not an assertion
                    }
                }
                else
                {
                    ECConsume(digits);
                    node = Anew(ctAllocator, MatchGroupNode, n);
                    return false; // not an assertion
                }
            }

            // Must be between 1 and 3 octal digits
            Assert(standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) // Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal

            deferredCharNode->cs[0] = UTC((UChar)n);
            node = deferredCharNode;
            return false; // not an assertion
        }
        else if (ECLookahead() == 'c')
        {
            Char c;
            if (standardEncodedChars->IsLetter(ECLookahead(1))) // terminating 0 is not a letter
            {
                c = UTC(Chars<EncodedChar>::CTU(ECLookahead(1)) % 32);
                ECConsume(2);
            }
            else
            {
                // SPEC DEVIATION: For non-letters or EOF, take the leading '\' to be itself, and
                //                 don't consume the 'c' or letter.
                c = '\\';
            }
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
        else
        {
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                node = Anew(ctAllocator, WordBoundaryNode, false);
                return true; // Is an assertion
            case 'B':
                node = Anew(ctAllocator, WordBoundaryNode, true);
                return true; // Is an assertion
            case 'f':
                c = '\f';
                break; // fall-through for identity escape
            case 'n':
                c = '\n';
                break; // fall-through for identity escape
            case 'r':
                c = '\r';
                break; // fall-through for identity escape
            case 't':
                c = '\t';
                break; // fall-through for identity escape
            case 'v':
                c = '\v';
                break; // fall-through for identity escape
            case 'd':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetDigits(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'D':
                {
                    node = GetNodeWithValidCharacterSet('D');
                    return false; // not an assertion
                }
            case 's':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetWhitespace(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'S':
                {
                    node = GetNodeWithValidCharacterSet('S');
                    return false; // not an assertion
                }
            case 'w':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    if (this->unicodeFlagPresent && this->caseInsensitiveFlagPresent)
                    {
                        standardChars->SetWordIUChars(ctAllocator, setNode->set);
                    }
                    else
                    {
                        standardChars->SetWordChars(ctAllocator, setNode->set);
                    }
                    node = setNode;
                    return false; // not an assertion
                }
            case 'W':
                {
                    node = GetNodeWithValidCharacterSet('W');
                    return false; // not an assertion
                }
            // case 'c': handled as special case above
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                        (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case 'u':
                if (unicodeFlagPresent && TryParseExtendedUnicodeEscape(c, previousSurrogatePart) > 0)
                    break;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    ECConsume(4);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case '^':
            case '$':
            case '\\':
            case '.':
            case '*':
            case '+':
            case '?':
            case '(':
            case ')':
            case '[':
            case ']':
            case '{':
            case '}':
            case '|':
            case '/':
                break; // fall-through for identity escape
            default:
                if (this->unicodeFlagPresent)
                {
                    // As per #sec-forbidden-extensions, if unicode flag is present, we must disallow any other escape.
                    this->Fail(JSERR_RegExpInvalidEscape); // throw SyntaxError
                }
                // As per Annex B, allow anything other than newlines and above. Embedded 0 is ok
                break;
            }

            // Must be an identity escape
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
    }